

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArraySamplingTest::textureDefinition::~textureDefinition
          (textureDefinition *this)

{
  if (this->m_texture_object_id != 0xffffffff) {
    if (this->m_gl != (Functions *)0x0) {
      (*this->m_gl->deleteTextures)(1,&this->m_texture_object_id);
      this->m_gl = (Functions *)0x0;
    }
    this->m_texture_object_id = 0xffffffff;
  }
  return;
}

Assistant:

TextureCubeMapArraySamplingTest::textureDefinition::~textureDefinition()
{
	if (m_invalid_texture_object_id != m_texture_object_id)
	{
		if (0 != m_gl)
		{
			m_gl->deleteTextures(1, &m_texture_object_id);

			m_gl = 0;
		}

		m_texture_object_id = m_invalid_texture_object_id;
	}
}